

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

bool __thiscall CPlayer::SetSpectatorID(CPlayer *this,int SpecMode,int SpectatorID)

{
  bool bVar1;
  int iVar2;
  CGameContext *pCVar3;
  CCharacter *pCVar4;
  CPlayer *pCVar5;
  int in_EDX;
  int in_ESI;
  CPlayer *in_RDI;
  CFlag *pFlag;
  CFlag *local_20;
  
  if (((in_ESI == in_RDI->m_SpecMode) && (in_ESI != 1)) ||
     (((in_RDI->m_SpecMode == 1 && (in_ESI == 1)) &&
      (((in_EDX == -1 || (in_RDI->m_SpectatorID == in_EDX)) || (in_RDI->m_ClientID == in_EDX)))))) {
    return false;
  }
  if (in_RDI->m_Team == -1) {
    if (in_ESI != 1) {
LAB_0013100a:
      if ((in_ESI != 2) && (in_ESI != 3)) {
        in_RDI->m_pSpecFlag = (CFlag *)0x0;
        in_RDI->m_SpecMode = in_ESI;
        in_RDI->m_SpectatorID = in_EDX;
        return true;
      }
      pCVar3 = GameServer(in_RDI);
      local_20 = (CFlag *)CGameWorld::FindFirst(&pCVar3->m_World,4);
      do {
        if (local_20 == (CFlag *)0x0) {
LAB_001310e2:
          if (in_RDI->m_pSpecFlag == (CFlag *)0x0) {
            return false;
          }
          in_RDI->m_SpecMode = in_ESI;
          return true;
        }
        iVar2 = CFlag::GetTeam(local_20);
        if (((iVar2 == 0) && (in_ESI == 2)) ||
           ((iVar2 = CFlag::GetTeam(local_20), iVar2 == 1 && (in_ESI == 3)))) {
          in_RDI->m_pSpecFlag = local_20;
          pCVar4 = CFlag::GetCarrier(local_20);
          if (pCVar4 == (CCharacter *)0x0) {
            in_RDI->m_SpectatorID = -1;
          }
          else {
            pCVar4 = CFlag::GetCarrier(local_20);
            pCVar5 = CCharacter::GetPlayer(pCVar4);
            iVar2 = GetCID(pCVar5);
            in_RDI->m_SpectatorID = iVar2;
          }
          goto LAB_001310e2;
        }
        local_20 = (CFlag *)CEntity::TypeNext(&local_20->super_CEntity);
      } while( true );
    }
    pCVar3 = GameServer(in_RDI);
    if (pCVar3->m_apPlayers[in_EDX] != (CPlayer *)0x0) {
      pCVar3 = GameServer(in_RDI);
      iVar2 = GetTeam(pCVar3->m_apPlayers[in_EDX]);
      if (iVar2 != -1) goto LAB_0013100a;
    }
  }
  else if ((((in_RDI->m_DeadSpecMode & 1U) != 0) && (in_ESI == 1)) &&
          (pCVar5 = in_RDI, pCVar3 = GameServer(in_RDI),
          pCVar3->m_apPlayers[in_EDX] != (CPlayer *)0x0)) {
    GameServer(in_RDI);
    bVar1 = DeadCanFollow(pCVar5,(CPlayer *)CONCAT44(in_ESI,in_EDX));
    if (bVar1) {
      in_RDI->m_SpecMode = in_ESI;
      in_RDI->m_pSpecFlag = (CFlag *)0x0;
      in_RDI->m_SpectatorID = in_EDX;
      return true;
    }
  }
  return false;
}

Assistant:

bool CPlayer::SetSpectatorID(int SpecMode, int SpectatorID)
{
	if((SpecMode == m_SpecMode && SpecMode != SPEC_PLAYER) ||
		(m_SpecMode == SPEC_PLAYER && SpecMode == SPEC_PLAYER && (SpectatorID == -1 || m_SpectatorID == SpectatorID || m_ClientID == SpectatorID)))
	{
		return false;
	}

	if(m_Team == TEAM_SPECTATORS)
	{
		// check for freeview or if wanted player is playing
		if(SpecMode != SPEC_PLAYER || (SpecMode == SPEC_PLAYER && GameServer()->m_apPlayers[SpectatorID] && GameServer()->m_apPlayers[SpectatorID]->GetTeam() != TEAM_SPECTATORS))
		{
			if(SpecMode == SPEC_FLAGRED || SpecMode == SPEC_FLAGBLUE)
			{
				CFlag *pFlag = (CFlag*)GameServer()->m_World.FindFirst(CGameWorld::ENTTYPE_FLAG);
				while (pFlag)
				{
					if ((pFlag->GetTeam() == TEAM_RED && SpecMode == SPEC_FLAGRED) || (pFlag->GetTeam() == TEAM_BLUE && SpecMode == SPEC_FLAGBLUE))
					{
						m_pSpecFlag = pFlag;
						if (pFlag->GetCarrier())
							m_SpectatorID = pFlag->GetCarrier()->GetPlayer()->GetCID();
						else
							m_SpectatorID = -1;
						break;
					}
					pFlag = (CFlag*)pFlag->TypeNext();
				}
				if (!m_pSpecFlag)
					return false;
				m_SpecMode = SpecMode;
				return true;
			}
			m_pSpecFlag = 0;
			m_SpecMode = SpecMode;
			m_SpectatorID = SpectatorID;
			return true;
		}
	}
	else if(m_DeadSpecMode)
	{
		// check if wanted player can be followed
		if(SpecMode == SPEC_PLAYER && GameServer()->m_apPlayers[SpectatorID] && DeadCanFollow(GameServer()->m_apPlayers[SpectatorID]))
		{
			m_SpecMode = SpecMode;
			m_pSpecFlag = 0;
			m_SpectatorID = SpectatorID;
			return true;
		}
	}

	return false;
}